

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

void redisAsyncDisconnect(redisAsyncContext *ac)

{
  int *piVar1;
  uint uVar2;
  redisCallback *__ptr;
  _func_void_void_ptr *p_Var3;
  redisContext *c;
  
  uVar2 = (ac->c).flags;
  (ac->c).flags = uVar2 & 0xfffffdfb | 4;
  if (((uVar2 & 0x10) != 0) || ((ac->replies).head != (redisCallback *)0x0)) {
    return;
  }
  if (ac != (redisAsyncContext *)0x0) {
    ac->err = (ac->c).err;
    ac->errstr = (ac->c).errstr;
  }
  if (ac->err == 0) {
    __ptr = (ac->replies).head;
    if (__ptr != (redisCallback *)0x0) {
      (ac->replies).head = __ptr->next;
      if (__ptr == (ac->replies).tail) {
        (ac->replies).tail = (redisCallback *)0x0;
      }
      free(__ptr);
      if (__ptr != (redisCallback *)0x0) {
        __assert_fail("ret == REDIS_ERR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/async.c"
                      ,0x148,"void __redisAsyncDisconnect(redisAsyncContext *)");
      }
    }
  }
  else {
    piVar1 = &(ac->c).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 4;
  }
  p_Var3 = (ac->ev).cleanup;
  if (p_Var3 != (_func_void_void_ptr *)0x0) {
    (*p_Var3)((ac->ev).data);
  }
  (ac->ev).cleanup = (_func_void_void_ptr *)0x0;
  if (((ac->c).flags & 0x200) != 0) {
    return;
  }
  __redisAsyncFree(ac);
  return;
}

Assistant:

void redisAsyncDisconnect(redisAsyncContext *ac) {
    redisContext *c = &(ac->c);
    c->flags |= REDIS_DISCONNECTING;

    /** unset the auto-free flag here, because disconnect undoes this */
    c->flags &= ~REDIS_NO_AUTO_FREE;
    if (!(c->flags & REDIS_IN_CALLBACK) && ac->replies.head == NULL)
        __redisAsyncDisconnect(ac);
}